

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O0

UBool icu_63::UnicodeSet::resemblesPropertyPattern(UnicodeString *pattern,int32_t pos)

{
  UBool UVar1;
  int32_t iVar2;
  undefined1 local_21;
  int32_t pos_local;
  UnicodeString *pattern_local;
  
  iVar2 = UnicodeString::length(pattern);
  if (iVar2 < pos + 5) {
    pattern_local._7_1_ = false;
  }
  else {
    UVar1 = anon_unknown_0::isPOSIXOpen(pattern,pos);
    local_21 = true;
    if (UVar1 == '\0') {
      UVar1 = anon_unknown_0::isPerlOpen(pattern,pos);
      local_21 = true;
      if (UVar1 == '\0') {
        UVar1 = anon_unknown_0::isNameOpen(pattern,pos);
        local_21 = UVar1 != '\0';
      }
    }
    pattern_local._7_1_ = local_21;
  }
  return pattern_local._7_1_;
}

Assistant:

UBool UnicodeSet::resemblesPropertyPattern(const UnicodeString& pattern,
                                           int32_t pos) {
    // Patterns are at least 5 characters long
    if ((pos+5) > pattern.length()) {
        return FALSE;
    }

    // Look for an opening [:, [:^, \p, or \P
    return isPOSIXOpen(pattern, pos) || isPerlOpen(pattern, pos) || isNameOpen(pattern, pos);
}